

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  StreamReplacer *__p;
  _Rb_tree_header *p_Var4;
  size_t sVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  QPDF qpdf;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  char *local_c0;
  QPDF local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_a0;
  ulong local_90;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_88;
  QPDFObjectHandle local_78;
  StreamReplacer *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc < 2) {
    local_c0 = (char *)0x0;
    local_90 = 0;
    pcVar8 = (char *)0x0;
  }
  else {
    uVar6 = 1;
    local_90 = 0;
    local_c0 = (char *)0x0;
    pcVar7 = (char *)0x0;
    do {
      __s1 = argv[uVar6];
      iVar3 = strcmp(__s1,"--decode-specialized");
      if (iVar3 == 0) {
        local_90 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        pcVar8 = pcVar7;
      }
      else {
        pcVar8 = __s1;
        if ((pcVar7 != (char *)0x0) &&
           (bVar10 = local_c0 != (char *)0x0, pcVar8 = pcVar7, local_c0 = __s1, bVar10))
        goto LAB_00105787;
      }
      uVar6 = uVar6 + 1;
      pcVar7 = pcVar8;
    } while ((uint)argc != uVar6);
  }
  if ((pcVar8 != (char *)0x0) && (local_c0 != (char *)0x0)) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/XORDecode","");
    local_58 = 0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<std::shared_ptr<QPDFStreamFilter>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/examples/pdf-custom-filter.cc:403:50)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<std::shared_ptr<QPDFStreamFilter>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/examples/pdf-custom-filter.cc:403:50)>
               ::_M_manager;
    QPDF::registerStreamFilter(&local_b0);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,(long)local_a0._vptr__Sp_counted_base + 1);
    }
    QPDF::QPDF(local_b8);
    QPDF::processFile((char *)local_b8,pcVar8);
    __p = (StreamReplacer *)operator_new(0x78);
    QPDFObjectHandle::StreamDataProvider::StreamDataProvider((StreamDataProvider *)__p,false);
    *(undefined ***)__p = &PTR__StreamReplacer_00109b08;
    __p->pdf = local_b8;
    p_Var4 = &(__p->copied_streams)._M_t._M_impl.super__Rb_tree_header;
    (__p->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    (__p->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header
    ;
    (__p->copied_streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var4 = &(__p->keys)._M_t._M_impl.super__Rb_tree_header;
    (__p->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    (__p->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    (__p->keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<StreamReplacer*>(&local_60,__p);
    QPDF::getAllObjects();
    p_Var1 = local_a8;
    if (local_b0 != local_a8) {
      p_Var9 = local_b0;
      do {
        cVar2 = QPDFObjectHandle::isStream();
        if (cVar2 != '\0') {
          local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)p_Var9->_vptr__Sp_counted_base;
          local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var9->_M_use_count;
          if (local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_78.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_78.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_78.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_78.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_88.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = &local_68->super_StreamDataProvider;
          local_88.
          super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_60._M_pi;
          if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
            }
          }
          StreamReplacer::registerStream(__p,&local_78,&local_88);
          if (local_88.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.
                       super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        p_Var9 = p_Var9 + 1;
      } while (p_Var9 != p_Var1);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_b0);
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_b0,local_b8,local_c0);
    if ((local_90 & 1) != 0) {
      QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&local_b0);
    }
    QPDFWriter::setStaticID(SUB81(&local_b0,0));
    QPDFWriter::write();
    pcVar8 = whoami;
    if (whoami == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b0b8);
    }
    else {
      sVar5 = strlen(whoami);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": new file written to ",0x16);
    sVar5 = strlen(local_c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c0,sVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    QPDF::~QPDF(local_b8);
    return 0;
  }
LAB_00105787:
  usage();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* outfilename = nullptr;
    bool decode_specialized = false;
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "--decode-specialized") == 0) {
            decode_specialized = true;
        } else if (!infilename) {
            infilename = argv[i];
        } else if (!outfilename) {
            outfilename = argv[i];
        } else {
            usage();
        }
    }
    if (!(infilename && outfilename)) {
        usage();
    }

    try {
        // Register our fictitious filter. This enables QPDFWriter to decode our streams. This is
        // not a real filter, so no real PDF reading application would be able to interpret it. This
        // is just for illustrative purposes.
        QPDF::registerStreamFilter("/XORDecode", [] { return std::make_shared<SF_XORDecode>(); });
        // Do the actual processing.
        process(infilename, outfilename, decode_specialized);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}